

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::
Table<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
::Table(Table<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
        *this)

{
  (this->rows).builder.ptr = (Entry *)0x0;
  (this->rows).builder.pos =
       (RemoveConst<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)0x0;
  (this->rows).builder.endPtr = (Entry *)0x0;
  (this->rows).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  _::BTreeImpl::BTreeImpl(&(this->indexes).impl);
  return;
}

Assistant:

Table<Row, Indexes...>::Table() {}